

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall
icu_63::UVector::insertElementAt(UVector *this,int32_t elem,int32_t index,UErrorCode *status)

{
  UBool UVar1;
  int local_24;
  int32_t i;
  UErrorCode *status_local;
  int32_t index_local;
  int32_t elem_local;
  UVector *this_local;
  
  if ((-1 < index) && (index <= this->count)) {
    UVar1 = ensureCapacity(this,this->count + 1,status);
    if (UVar1 != '\0') {
      for (local_24 = this->count; index < local_24; local_24 = local_24 + -1) {
        this->elements[local_24] = this->elements[local_24 + -1];
      }
      this->elements[index].pointer = (void *)0x0;
      this->elements[index].integer = elem;
      this->count = this->count + 1;
    }
  }
  return;
}

Assistant:

void UVector::insertElementAt(int32_t elem, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index].pointer = NULL;
        elements[index].integer = elem;
        ++count;
    }
    /* else index out of range */
}